

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

BSDF * __thiscall
pbrt::DiffuseMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,BSDF *__return_storage_ptr__,DiffuseMaterial *this,
          SampledWavelengths *param_5,undefined8 *param_6,undefined8 param_7,undefined8 param_8,
          undefined8 param_9,ulong param_10,undefined8 param_11,undefined8 param_12,
          undefined8 param_13,undefined8 param_14,undefined8 param_15,undefined8 param_16)

{
  ulong uVar1;
  undefined8 uVar2;
  float fVar3;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  undefined1 auVar4 [16];
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  UniversalTextureEvaluator local_89;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  BxDFHandle local_70;
  uintptr_t local_68;
  uintptr_t local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 extraout_var [60];
  
  local_60 = (this->reflectance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  local_58 = *(undefined8 *)(param_5->lambda).values;
  uStack_50 = *(undefined8 *)((param_5->lambda).values + 2);
  uStack_48 = *(undefined8 *)(param_5->pdf).values;
  uStack_40 = *(undefined8 *)((param_5->pdf).values + 2);
  auVar7 = ZEXT856(param_10);
  auVar10 = ZEXT856(param_2);
  ctx._8_8_ = param_10;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx._32_8_ = param_13;
  ctx._40_8_ = param_14;
  ctx._48_8_ = param_15;
  ctx._56_8_ = param_16;
  SVar11 = UniversalTextureEvaluator::operator()
                     (&local_89,(SpectrumTextureHandle)&local_60,ctx,*param_5);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar5._0_8_ = SVar11.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  auVar4 = vmovlhps_avx(auVar5._0_16_,auVar9._0_16_);
  auVar8._8_4_ = 0x3f800000;
  auVar8._0_8_ = 0x3f8000003f800000;
  auVar8._12_4_ = 0x3f800000;
  uVar1 = vcmpps_avx512vl(auVar4,ZEXT816(0) << 0x40,5);
  auVar4 = vminps_avx512vl(auVar8,auVar4);
  local_88 = (uint)((byte)uVar1 & 1) * auVar4._0_4_;
  iStack_84 = (uint)((byte)(uVar1 >> 1) & 1) * auVar4._4_4_;
  iStack_80 = (uint)((byte)(uVar1 >> 2) & 1) * auVar4._8_4_;
  iStack_7c = (uint)((byte)(uVar1 >> 3) & 1) * auVar4._12_4_;
  local_68 = (this->sigma).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_00._8_8_ = param_10;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_00._32_8_ = param_13;
  ctx_00._40_8_ = param_14;
  ctx_00._48_8_ = param_15;
  ctx_00._56_8_ = param_16;
  auVar6._0_4_ = UniversalTextureEvaluator::operator()
                           (&local_89,(FloatTextureHandle)&local_68,ctx_00);
  auVar6._4_60_ = extraout_var;
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x42b40000),0),auVar6._0_16_);
  uVar2 = vcmpss_avx512f(auVar6._0_16_,ZEXT816(0) << 0x40,1);
  fVar3 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)(auVar4._0_4_ * 0.017453292));
  fVar3 = fVar3 * fVar3;
  *param_6 = CONCAT44(iStack_84,local_88);
  param_6[1] = CONCAT44(iStack_7c,iStack_80);
  *(undefined1 (*) [16])(param_6 + 2) = ZEXT816(0) << 0x20;
  *(float *)(param_6 + 4) = 1.0 - fVar3 / (fVar3 + 0.33 + fVar3 + 0.33);
  *(float *)((long)param_6 + 0x24) = (fVar3 * 0.45) / (fVar3 + 0.09);
  local_70.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_6 | 0x2000000000000);
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_70,1.0);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, DiffuseBxDF *bxdf) const {
        // Evaluate textures for _DiffuseMaterial_ and allocate BSDF
        SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
        Float sig = Clamp(texEval(sigma, ctx), 0, 90);
        *bxdf = DiffuseBxDF(r, SampledSpectrum(0), sig);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }